

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError WriteImage(WebPPicture *pic,VP8LBitWriter *bw,size_t *coded_size)

{
  int iVar1;
  uint8_t *puVar2;
  WebPPicture *pic_00;
  undefined1 *riff_size_00;
  ulong vp8l_size_00;
  long *in_RDX;
  VP8LBitWriter *in_RSI;
  long in_RDI;
  uint8_t pad_byte [1];
  size_t riff_size;
  size_t pad;
  size_t vp8l_size;
  size_t webpll_size;
  uint8_t *webpll_data;
  WebPEncodingError err;
  undefined1 local_51;
  long local_50;
  WebPEncodingError local_24;
  
  puVar2 = VP8LBitWriterFinish((VP8LBitWriter *)0x187e05);
  pic_00 = (WebPPicture *)VP8LBitWriterNumBytes(in_RSI);
  riff_size_00 = (undefined1 *)((long)&pic_00->use_argb + 1);
  vp8l_size_00 = (ulong)riff_size_00 & 1;
  local_50 = (long)pic_00->pad1 + (vp8l_size_00 - 0x2f);
  local_24 = WriteRiffHeader(pic_00,(size_t)riff_size_00,vp8l_size_00);
  if (local_24 == VP8_ENC_OK) {
    iVar1 = (**(code **)(in_RDI + 0x60))(puVar2,pic_00,in_RDI);
    if (iVar1 != 0) {
      if (vp8l_size_00 != 0) {
        memset(&local_51,0,1);
        iVar1 = (**(code **)(in_RDI + 0x60))(&local_51,1,in_RDI);
        if (iVar1 == 0) {
          return VP8_ENC_ERROR_BAD_WRITE;
        }
      }
      *in_RDX = local_50 + 8;
      return VP8_ENC_OK;
    }
    local_24 = VP8_ENC_ERROR_BAD_WRITE;
  }
  return local_24;
}

Assistant:

static WebPEncodingError WriteImage(const WebPPicture* const pic,
                                    VP8LBitWriter* const bw,
                                    size_t* const coded_size) {
  WebPEncodingError err = VP8_ENC_OK;
  const uint8_t* const webpll_data = VP8LBitWriterFinish(bw);
  const size_t webpll_size = VP8LBitWriterNumBytes(bw);
  const size_t vp8l_size = VP8L_SIGNATURE_SIZE + webpll_size;
  const size_t pad = vp8l_size & 1;
  const size_t riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8l_size + pad;

  err = WriteRiffHeader(pic, riff_size, vp8l_size);
  if (err != VP8_ENC_OK) goto Error;

  if (!pic->writer(webpll_data, webpll_size, pic)) {
    err = VP8_ENC_ERROR_BAD_WRITE;
    goto Error;
  }

  if (pad) {
    const uint8_t pad_byte[1] = { 0 };
    if (!pic->writer(pad_byte, 1, pic)) {
      err = VP8_ENC_ERROR_BAD_WRITE;
      goto Error;
    }
  }
  *coded_size = CHUNK_HEADER_SIZE + riff_size;
  return VP8_ENC_OK;

 Error:
  return err;
}